

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChConstraint.cpp
# Opt level: O2

ChEnumMapper<chrono::eChConstraintMode> * __thiscall
chrono::eChConstraintMode_mapper::operator()
          (ChEnumMapper<chrono::eChConstraintMode> *__return_storage_ptr__,
          eChConstraintMode_mapper *this,eChConstraintMode *mval)

{
  __shared_ptr<std::vector<chrono::ChEnumNamePair<chrono::eChConstraintMode>,_std::allocator<chrono::ChEnumNamePair<chrono::eChConstraintMode>_>_>,_(__gnu_cxx::_Lock_policy)2>
  _Stack_28;
  
  std::
  __shared_ptr<std::vector<chrono::ChEnumNamePair<chrono::eChConstraintMode>,_std::allocator<chrono::ChEnumNamePair<chrono::eChConstraintMode>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ::__shared_ptr(&_Stack_28,
                 &(this->super_ChEnumMapper<chrono::eChConstraintMode>).enummap.
                  super___shared_ptr<std::vector<chrono::ChEnumNamePair<chrono::eChConstraintMode>,_std::allocator<chrono::ChEnumNamePair<chrono::eChConstraintMode>_>_>,_(__gnu_cxx::_Lock_policy)2>
                );
  ChEnumMapper<chrono::eChConstraintMode>::ChEnumMapper
            (__return_storage_ptr__,
             (shared_ptr<std::vector<chrono::ChEnumNamePair<chrono::eChConstraintMode>,_std::allocator<chrono::ChEnumNamePair<chrono::eChConstraintMode>_>_>_>
              *)&_Stack_28);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_28._M_refcount);
  __return_storage_ptr__->value_ptr = mval;
  return __return_storage_ptr__;
}

Assistant:

void ChConstraint::ArchiveOUT(ChArchiveOut& marchive) {
    // version number
    marchive.VersionWrite<ChConstraint>();

    // serialize all member data:
    marchive << CHNVP(cfm_i);
    marchive << CHNVP(valid);
    marchive << CHNVP(disabled);
    marchive << CHNVP(redundant);
    marchive << CHNVP(broken);
    eChConstraintMode_mapper typemapper;
    marchive << CHNVP(typemapper(this->mode), "mode");
}